

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_Dfs(Fraig_Man_t *pMan,int fEquiv)

{
  Fraig_NodeVec_t *vNodes_00;
  int local_24;
  int i;
  Fraig_NodeVec_t *vNodes;
  int fEquiv_local;
  Fraig_Man_t *pMan_local;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes_00 = Fraig_NodeVecAlloc(100);
  for (local_24 = 0; local_24 < pMan->vOutputs->nSize; local_24 = local_24 + 1) {
    Fraig_Dfs_rec(pMan,(Fraig_Node_t *)
                       ((ulong)pMan->vOutputs->pArray[local_24] & 0xfffffffffffffffe),vNodes_00,
                  fEquiv);
  }
  return vNodes_00;
}

Assistant:

Fraig_NodeVec_t * Fraig_Dfs( Fraig_Man_t * pMan, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int i;
    pMan->nTravIds++;
    vNodes = Fraig_NodeVecAlloc( 100 );
    for ( i = 0; i < pMan->vOutputs->nSize; i++ )
        Fraig_Dfs_rec( pMan, Fraig_Regular(pMan->vOutputs->pArray[i]), vNodes, fEquiv );
    return vNodes;
}